

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseParameterProperty
               (Parameter *param,string *err,json *o,string *prop,bool required)

{
  bool bVar1;
  bool bVar2;
  reference pbVar3;
  string *psVar4;
  undefined1 uVar5;
  string *parent_node;
  string *parent_node_00;
  json_const_iterator it;
  double numVal;
  json_const_iterator it2;
  json_const_iterator itEnd;
  string local_b8;
  double local_98;
  const_iterator local_90;
  string local_70;
  const_iterator local_50;
  
  parent_node = &local_b8;
  parent_node_00 = &local_b8;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity =
       local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  uVar5 = 0;
  psVar4 = prop;
  bVar1 = ParseStringProperty(&param->string_value,err,o,prop,false,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_90);
    bVar1 = ParseNumberArrayProperty
                      (&param->number_array,(string *)o,(json *)prop,psVar4,(bool)uVar5,parent_node)
    ;
    std::__cxx11::string::~string((string *)&local_b8);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_90);
      uVar5 = 0;
      psVar4 = prop;
      bVar1 = ParseNumberProperty(&param->number_value,err,o,prop,false,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) {
        param->has_number_value = true;
      }
      else {
        local_b8.field_2._M_allocated_capacity = 0;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        local_b8.field_2._8_8_ = 0x8000000000000000;
        bVar1 = detail::FindMember(o,(prop->_M_dataplus)._M_p,(json_const_iterator *)&local_b8);
        if ((bVar1) &&
           (pbVar3 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_b8), pbVar3->m_type == object)) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::clear(&(param->json_double_value)._M_t);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cbegin(&local_90,pbVar3);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cend(&local_50,pbVar3);
          while (bVar1 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::
                         operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                   (&local_90,&local_50), bVar1) {
            pbVar3 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_90);
            bVar1 = detail::GetNumber(pbVar3,&local_98);
            if (bVar1) {
              detail::GetKey(&local_70,&local_90);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
              ::_M_emplace_unique<std::__cxx11::string,double&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                          *)&param->json_double_value,&local_70,&local_98);
              std::__cxx11::string::~string((string *)&local_70);
            }
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&local_90);
          }
          return true;
        }
        std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_90);
        bVar2 = ParseBooleanProperty
                          (&param->bool_value,(string *)o,(json *)prop,psVar4,(bool)uVar5,
                           parent_node_00);
        std::__cxx11::string::~string((string *)&local_b8);
      }
    }
  }
  return bVar2;
}

Assistant:

static bool ParseParameterProperty(Parameter *param, std::string *err,
                                   const detail::json &o,
                                   const std::string &prop, bool required) {
  // A parameter value can either be a string or an array of either a boolean or
  // a number. Booleans of any kind aren't supported here. Granted, it
  // complicates the Parameter structure and breaks it semantically in the sense
  // that the client probably works off the assumption that if the string is
  // empty the vector is used, etc. Would a tagged union work?
  if (ParseStringProperty(&param->string_value, err, o, prop, false)) {
    // Found string property.
    return true;
  } else if (ParseNumberArrayProperty(&param->number_array, err, o, prop,
                                      false)) {
    // Found a number array.
    return true;
  } else if (ParseNumberProperty(&param->number_value, err, o, prop, false)) {
    param->has_number_value = true;
    return true;
  } else if (ParseJSONProperty(&param->json_double_value, err, o, prop,
                               false)) {
    return true;
  } else if (ParseBooleanProperty(&param->bool_value, err, o, prop, false)) {
    return true;
  } else {
    if (required) {
      if (err) {
        (*err) += "parameter must be a string or number / number array.\n";
      }
    }
    return false;
  }
}